

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int fy_node_mapping_sort_cmp_no_qsort_r(void *a,void *b)

{
  fy_node_pair **ppfVar1;
  int iVar2;
  
  ppfVar1 = fy_node_mapping_sort_ctx_no_qsort_r->fynpp;
  if ((a < ppfVar1) || (ppfVar1 + fy_node_mapping_sort_ctx_no_qsort_r->count <= a)) {
    __assert_fail("fynppa >= ctx->fynpp && fynppa < ctx->fynpp + ctx->count",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                  ,0x14ab,"int fy_node_mapping_sort_cmp(const void *, const void *, void *)");
  }
  if ((ppfVar1 <= b) && (b < ppfVar1 + fy_node_mapping_sort_ctx_no_qsort_r->count)) {
    iVar2 = (*fy_node_mapping_sort_ctx_no_qsort_r->key_cmp)
                      (*a,*b,fy_node_mapping_sort_ctx_no_qsort_r->arg);
    return iVar2;
  }
  __assert_fail("fynppb >= ctx->fynpp && fynppb < ctx->fynpp + ctx->count",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                ,0x14ac,"int fy_node_mapping_sort_cmp(const void *, const void *, void *)");
}

Assistant:

static int fy_node_mapping_sort_cmp_no_qsort_r(const void *a, const void *b) {
#ifdef __APPLE__
                                                                                                                            return fy_node_mapping_sort_cmp(
			fy_node_mapping_sort_ctx_no_qsort_r,
			a, b);
#else
    return fy_node_mapping_sort_cmp(a, b,
                                    fy_node_mapping_sort_ctx_no_qsort_r);
#endif
}